

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

void __thiscall soul::TokenisedPathString::~TokenisedPathString(TokenisedPathString *this)

{
  TokenisedPathString *this_local;
  
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::~ArrayWithPreallocation
            (&this->sections);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TokenisedPathString (std::string path) : fullPath (std::move (path))
    {
        size_t currentSectionStart = 0;
        auto length = fullPath.length();

        while (currentSectionStart < length)
        {
            auto nextBreak = fullPath.find ("::", currentSectionStart);
            SOUL_ASSERT (nextBreak != 0);

            if (nextBreak == std::string::npos)
            {
                sections.push_back ({ currentSectionStart, length });
                break;
            }

            sections.push_back ({ currentSectionStart, nextBreak });
            currentSectionStart = nextBreak + 2;
        }
    }